

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiNoncentralAbsolutePoseSacProblem.hpp
# Opt level: O0

void __thiscall
opengv::sac_problems::absolute_pose::MultiNoncentralAbsolutePoseSacProblem::
MultiNoncentralAbsolutePoseSacProblem
          (MultiNoncentralAbsolutePoseSacProblem *this,adapter_t *adapter,bool asCentral)

{
  vector<int,_std::allocator<int>_> *this_00;
  byte in_DL;
  long *in_RSI;
  undefined8 *in_RDI;
  size_t i;
  vector<int,_std::allocator<int>_> numberCorrespondences;
  bool in_stack_0000136f;
  MultiSampleConsensusProblem<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *in_stack_00001370;
  value_type *in_stack_ffffffffffffff78;
  vector<int,_std::allocator<int>_> *pvVar1;
  vector<int,_std::allocator<int>_> *__x;
  MultiSampleConsensusProblem<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *in_stack_ffffffffffffffd0;
  
  sac::MultiSampleConsensusProblem<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>::
  MultiSampleConsensusProblem(in_stack_00001370,in_stack_0000136f);
  *in_RDI = &PTR__MultiNoncentralAbsolutePoseSacProblem_00c1ec60;
  in_RDI[0x27c] = in_RSI;
  *(byte *)(in_RDI + 0x27d) = in_DL & 1;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x6f6079);
  pvVar1 = (vector<int,_std::allocator<int>_> *)0x0;
  while( true ) {
    __x = pvVar1;
    this_00 = (vector<int,_std::allocator<int>_> *)(**(code **)(*in_RSI + 0x70))();
    if (this_00 <= pvVar1) break;
    pvVar1 = (vector<int,_std::allocator<int>_> *)(**(code **)(*in_RSI + 0x68))(in_RSI,__x);
    std::vector<int,_std::allocator<int>_>::push_back(pvVar1,in_stack_ffffffffffffff78);
    pvVar1 = (vector<int,_std::allocator<int>_> *)
             ((long)&(__x->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start + 1);
  }
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffffd0,__x);
  sac::MultiSampleConsensusProblem<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>::setUniformIndices
            (in_stack_ffffffffffffffd0,__x);
  std::vector<int,_std::allocator<int>_>::~vector(this_00);
  std::vector<int,_std::allocator<int>_>::~vector(this_00);
  return;
}

Assistant:

MultiNoncentralAbsolutePoseSacProblem(adapter_t & adapter, bool asCentral = false) :
      sac::MultiSampleConsensusProblem<model_t> (),
      _adapter(adapter),
      _asCentral(asCentral)
  {
    std::vector<int> numberCorrespondences;
    for(size_t i = 0; i < adapter.getNumberFrames(); i++)
      numberCorrespondences.push_back(adapter.getNumberCorrespondences(i));
    setUniformIndices(numberCorrespondences);
  }